

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O2

REF_STATUS ref_export_tec_surf(REF_GRID ref_grid,char *filename)

{
  uint uVar1;
  FILE *__s;
  
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x311,
           "ref_export_tec_surf","unable to open file");
    uVar1 = 2;
  }
  else {
    fwrite("title=\"tecplot refine geometry file\"\n",0x25,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,__s);
    uVar1 = ref_export_tec_surf_zone(ref_grid,(FILE *)__s);
    if (uVar1 == 0) {
      fclose(__s);
      uVar1 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x316,"ref_export_tec_surf",(ulong)uVar1,"surf");
    }
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_export_tec_surf(REF_GRID ref_grid,
                                       const char *filename) {
  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine geometry file\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\"\n");

  RSS(ref_export_tec_surf_zone(ref_grid, file), "surf");

  fclose(file);
  return REF_SUCCESS;
}